

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

float64 float64_add(float64 a,float64 b)

{
  int16 count;
  float64 fVar2;
  ulong uVar3;
  ulong uVar4;
  byte zSign;
  uint uVar5;
  ushort uVar6;
  bits64 bVar7;
  ulong a_00;
  ulong uStack_40;
  ulong uStack_38;
  ushort uVar1;
  
  zSign = (byte)(a >> 0x3f);
  if (a >> 0x3f == b >> 0x3f) {
    fVar2 = addFloat64Sigs(a,b,zSign);
    return fVar2;
  }
  uVar4 = a & 0xfffffffffffff;
  uVar5 = (uint)(a >> 0x34) & 0x7ff;
  uVar3 = b & 0xfffffffffffff;
  uVar6 = (ushort)(b >> 0x34) & 0x7ff;
  a_00 = uVar4 << 10;
  bVar7 = uVar3 << 10;
  uVar1 = (ushort)uVar5;
  count = uVar1 - uVar6;
  uStack_40 = bVar7;
  uStack_38 = a_00;
  if (count == 0 || uVar1 < uVar6) {
    if (count < 0) {
      if (uVar6 == 0x7ff) {
        if (uVar3 == 0) {
          return (ulong)(byte)~zSign << 0x3f | 0x7ff0000000000000;
        }
        goto LAB_00336f2f;
      }
      if (uVar1 == 0) {
        count = count + 1;
      }
      else {
        a_00 = a_00 | 0x4000000000000000;
      }
      uStack_38 = a_00;
      shift64RightJamming(a_00,-count,&uStack_38);
      bVar7 = bVar7 | 0x4000000000000000;
      uVar1 = uVar6;
    }
    else {
      if (uVar1 == 0) {
        uVar1 = 1;
        uVar6 = 1;
      }
      else if (uVar5 == 0x7ff) {
        if (uVar3 == 0 && uVar4 == 0) {
          float_exception_flags = float_exception_flags | 1;
          return 0xffffffffffffffff;
        }
        goto LAB_00336f2f;
      }
      if (bVar7 < a_00) goto LAB_00336fcd;
      uVar1 = uVar6;
      if (bVar7 <= a_00) {
        return (ulong)(float_rounding_mode == '\x02') << 0x3f;
      }
    }
    bVar7 = bVar7 - uStack_38;
    zSign = zSign ^ 1;
  }
  else {
    if (uVar1 == 0x7ff) {
      if (uVar4 == 0) {
        return a;
      }
LAB_00336f2f:
      fVar2 = propagateFloat64NaN(a,b);
      return fVar2;
    }
    if (uVar6 == 0) {
      count = count + -1;
    }
    else {
      bVar7 = bVar7 | 0x4000000000000000;
    }
    uStack_40 = bVar7;
    shift64RightJamming(bVar7,count,&uStack_40);
    a_00 = a_00 | 0x4000000000000000;
LAB_00336fcd:
    bVar7 = a_00 - uStack_40;
  }
  fVar2 = normalizeRoundAndPackFloat64(zSign,uVar1 - 1,bVar7);
  return fVar2;
}

Assistant:

float64 float64_add( float64 a, float64 b )
{
	flag aSign, bSign;

	aSign = extractFloat64Sign( a );
	bSign = extractFloat64Sign( b );
	if ( aSign == bSign ) {
		return addFloat64Sigs( a, b, aSign );
	}
	else {
		return subFloat64Sigs( a, b, aSign );
	}

}